

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Swish_x86_fma::forward_inplace(Swish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [32];
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  
  iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar13 = 0;
  uVar12 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar12 = uVar13;
  }
  auVar51 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar8 = (undefined1 (*) [32])(sVar5 * uVar13 * sVar4 + (long)pvVar3);
    lVar11 = 0;
    for (iVar10 = 0; auVar50 = auVar51._0_16_, iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
      auVar2 = *pauVar8;
      auVar16._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = -auVar2._8_4_;
      auVar16._12_4_ = -auVar2._12_4_;
      auVar16._16_4_ = -auVar2._16_4_;
      auVar16._20_4_ = -auVar2._20_4_;
      auVar16._24_4_ = -auVar2._24_4_;
      auVar16._28_4_ = auVar2._28_4_ ^ 0x80000000;
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar23._16_4_ = 0x42b0c0a5;
      auVar23._20_4_ = 0x42b0c0a5;
      auVar23._24_4_ = 0x42b0c0a5;
      auVar23._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar23);
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar24._16_4_ = 0xc2b0c0a5;
      auVar24._20_4_ = 0xc2b0c0a5;
      auVar24._24_4_ = 0xc2b0c0a5;
      auVar24._28_4_ = 0xc2b0c0a5;
      auVar6 = vmaxps_avx(auVar16,auVar24);
      auVar25._8_4_ = 0x3fb8aa3b;
      auVar25._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar25._12_4_ = 0x3fb8aa3b;
      auVar25._16_4_ = 0x3fb8aa3b;
      auVar25._20_4_ = 0x3fb8aa3b;
      auVar25._24_4_ = 0x3fb8aa3b;
      auVar25._28_4_ = 0x3fb8aa3b;
      auVar40._8_4_ = 0x3f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._12_4_ = 0x3f000000;
      auVar40._16_4_ = 0x3f000000;
      auVar40._20_4_ = 0x3f000000;
      auVar40._24_4_ = 0x3f000000;
      auVar40._28_4_ = 0x3f000000;
      auVar18 = vfmadd213ps_fma(auVar25,auVar6,auVar40);
      auVar17 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar16 = vcmpps_avx(ZEXT1632(auVar18),auVar17,1);
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar45._16_4_ = 0x3f800000;
      auVar45._20_4_ = 0x3f800000;
      auVar45._24_4_ = 0x3f800000;
      auVar45._28_4_ = 0x3f800000;
      auVar16 = vandps_avx(auVar16,auVar45);
      auVar16 = vsubps_avx(auVar17,auVar16);
      auVar34._8_4_ = 0x3f318000;
      auVar34._0_8_ = 0x3f3180003f318000;
      auVar34._12_4_ = 0x3f318000;
      auVar34._16_4_ = 0x3f318000;
      auVar34._20_4_ = 0x3f318000;
      auVar34._24_4_ = 0x3f318000;
      auVar34._28_4_ = 0x3f318000;
      auVar18 = vfmsub231ps_fma(auVar6,auVar16,auVar34);
      auVar35._8_4_ = 0x395e8083;
      auVar35._0_8_ = 0x395e8083395e8083;
      auVar35._12_4_ = 0x395e8083;
      auVar35._16_4_ = 0x395e8083;
      auVar35._20_4_ = 0x395e8083;
      auVar35._24_4_ = 0x395e8083;
      auVar35._28_4_ = 0x395e8083;
      auVar28 = vfmsub231ps_fma(ZEXT1632(auVar18),auVar16,auVar35);
      auVar17 = ZEXT1632(auVar28);
      auVar6._28_4_ = 0x395e8083;
      auVar6._0_28_ =
           ZEXT1628(CONCAT412(auVar28._12_4_ * auVar28._12_4_,
                              CONCAT48(auVar28._8_4_ * auVar28._8_4_,
                                       CONCAT44(auVar28._4_4_ * auVar28._4_4_,
                                                auVar28._0_4_ * auVar28._0_4_))));
      auVar38._8_4_ = 0x39506967;
      auVar38._0_8_ = 0x3950696739506967;
      auVar38._12_4_ = 0x39506967;
      auVar38._16_4_ = 0x39506967;
      auVar38._20_4_ = 0x39506967;
      auVar38._24_4_ = 0x39506967;
      auVar38._28_4_ = 0x39506967;
      auVar46._8_4_ = 0x3ab743ce;
      auVar46._0_8_ = 0x3ab743ce3ab743ce;
      auVar46._12_4_ = 0x3ab743ce;
      auVar46._16_4_ = 0x3ab743ce;
      auVar46._20_4_ = 0x3ab743ce;
      auVar46._24_4_ = 0x3ab743ce;
      auVar46._28_4_ = 0x3ab743ce;
      auVar18 = vfmadd213ps_fma(auVar38,auVar17,auVar46);
      auVar47._8_4_ = 0x3c088908;
      auVar47._0_8_ = 0x3c0889083c088908;
      auVar47._12_4_ = 0x3c088908;
      auVar47._16_4_ = 0x3c088908;
      auVar47._20_4_ = 0x3c088908;
      auVar47._24_4_ = 0x3c088908;
      auVar47._28_4_ = 0x3c088908;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar17,auVar47);
      auVar48._8_4_ = 0x3d2aa9c1;
      auVar48._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar48._12_4_ = 0x3d2aa9c1;
      auVar48._16_4_ = 0x3d2aa9c1;
      auVar48._20_4_ = 0x3d2aa9c1;
      auVar48._24_4_ = 0x3d2aa9c1;
      auVar48._28_4_ = 0x3d2aa9c1;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar17,auVar48);
      auVar49._8_4_ = 0x3e2aaaaa;
      auVar49._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar49._12_4_ = 0x3e2aaaaa;
      auVar49._16_4_ = 0x3e2aaaaa;
      auVar49._20_4_ = 0x3e2aaaaa;
      auVar49._24_4_ = 0x3e2aaaaa;
      auVar49._28_4_ = 0x3e2aaaaa;
      auVar17 = ZEXT1632(auVar28);
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar17,auVar49);
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar17,auVar40);
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar6,auVar17);
      auVar17._0_4_ = auVar18._0_4_ + 1.0;
      auVar17._4_4_ = auVar18._4_4_ + 1.0;
      auVar17._8_4_ = auVar18._8_4_ + 1.0;
      auVar17._12_4_ = auVar18._12_4_ + 1.0;
      auVar17._16_4_ = 0x3f800000;
      auVar17._20_4_ = 0x3f800000;
      auVar17._24_4_ = 0x3f800000;
      auVar17._28_4_ = 0x3f800000;
      auVar18._0_4_ = (int)auVar16._0_4_;
      auVar18._4_4_ = (int)auVar16._4_4_;
      auVar18._8_4_ = (int)auVar16._8_4_;
      auVar18._12_4_ = (int)auVar16._12_4_;
      auVar26._16_4_ = (int)auVar16._16_4_;
      auVar26._0_16_ = auVar18;
      auVar26._20_4_ = (int)auVar16._20_4_;
      auVar26._24_4_ = (int)auVar16._24_4_;
      auVar26._28_4_ = (int)auVar16._28_4_;
      auVar28 = vpslld_avx(auVar18,0x17);
      auVar18 = vpslld_avx(auVar26._16_16_,0x17);
      auVar18 = vpaddd_avx(auVar50,auVar18);
      auVar50 = vpaddd_avx(auVar50,auVar28);
      auVar27._16_16_ = auVar18;
      auVar27._0_16_ = auVar50;
      auVar50 = vfmadd213ps_fma(auVar27,auVar17,auVar45);
      auVar16 = vrcpps_avx(ZEXT1632(auVar50));
      auVar36._0_4_ = auVar2._0_4_ * auVar16._0_4_;
      auVar36._4_4_ = auVar2._4_4_ * auVar16._4_4_;
      auVar36._8_4_ = auVar2._8_4_ * auVar16._8_4_;
      auVar36._12_4_ = auVar2._12_4_ * auVar16._12_4_;
      auVar36._16_4_ = auVar2._16_4_ * auVar16._16_4_;
      auVar36._20_4_ = auVar2._20_4_ * auVar16._20_4_;
      auVar36._24_4_ = auVar2._24_4_ * auVar16._24_4_;
      auVar36._28_4_ = 0;
      auVar50 = vfmsub213ps_fma(ZEXT1632(auVar50),auVar36,auVar2);
      auVar50 = vfnmadd213ps_fma(ZEXT1632(auVar50),auVar16,auVar36);
      *pauVar8 = ZEXT1632(auVar50);
      pauVar8 = pauVar8 + 1;
      lVar11 = lVar11 + 8;
    }
    for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
      auVar18 = *(undefined1 (*) [16])*pauVar8;
      auVar28._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = -auVar18._8_4_;
      auVar28._12_4_ = -auVar18._12_4_;
      auVar19._8_4_ = 0x42b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._12_4_ = 0x42b0c0a5;
      auVar28 = vminps_avx(auVar28,auVar19);
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar15 = vmaxps_avx(auVar28,auVar20);
      auVar21._8_4_ = 0x3fb8aa3b;
      auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar21._12_4_ = 0x3fb8aa3b;
      auVar39._8_4_ = 0x3f000000;
      auVar39._0_8_ = 0x3f0000003f000000;
      auVar39._12_4_ = 0x3f000000;
      auVar28 = vfmadd213ps_fma(auVar21,auVar15,auVar39);
      auVar29._0_4_ = (int)auVar28._0_4_;
      auVar29._4_4_ = (int)auVar28._4_4_;
      auVar29._8_4_ = (int)auVar28._8_4_;
      auVar29._12_4_ = (int)auVar28._12_4_;
      auVar19 = vcvtdq2ps_avx(auVar29);
      auVar28 = vcmpps_avx(auVar28,auVar19,1);
      auVar28 = vandps_avx(auVar50,auVar28);
      auVar28 = vsubps_avx(auVar19,auVar28);
      auVar30._8_4_ = 0x3f318000;
      auVar30._0_8_ = 0x3f3180003f318000;
      auVar30._12_4_ = 0x3f318000;
      auVar19 = vfmsub231ps_fma(auVar15,auVar28,auVar30);
      auVar31._8_4_ = 0x395e8083;
      auVar31._0_8_ = 0x395e8083395e8083;
      auVar31._12_4_ = 0x395e8083;
      auVar15 = vfmsub231ps_fma(auVar19,auVar28,auVar31);
      auVar32._0_4_ = auVar15._0_4_ * auVar15._0_4_;
      auVar32._4_4_ = auVar15._4_4_ * auVar15._4_4_;
      auVar32._8_4_ = auVar15._8_4_ * auVar15._8_4_;
      auVar32._12_4_ = auVar15._12_4_ * auVar15._12_4_;
      auVar37._8_4_ = 0x39506967;
      auVar37._0_8_ = 0x3950696739506967;
      auVar37._12_4_ = 0x39506967;
      auVar41._8_4_ = 0x3ab743ce;
      auVar41._0_8_ = 0x3ab743ce3ab743ce;
      auVar41._12_4_ = 0x3ab743ce;
      auVar19 = vfmadd213ps_fma(auVar37,auVar15,auVar41);
      auVar42._8_4_ = 0x3c088908;
      auVar42._0_8_ = 0x3c0889083c088908;
      auVar42._12_4_ = 0x3c088908;
      auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar42);
      auVar43._8_4_ = 0x3d2aa9c1;
      auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar43._12_4_ = 0x3d2aa9c1;
      auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar43);
      auVar44._8_4_ = 0x3e2aaaaa;
      auVar44._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar44._12_4_ = 0x3e2aaaaa;
      auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar44);
      auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar39);
      auVar19 = vfmadd213ps_fma(auVar19,auVar32,auVar15);
      auVar15._0_4_ = auVar51._0_4_ + auVar19._0_4_;
      auVar15._4_4_ = auVar51._4_4_ + auVar19._4_4_;
      auVar15._8_4_ = auVar51._8_4_ + auVar19._8_4_;
      auVar15._12_4_ = auVar51._12_4_ + auVar19._12_4_;
      auVar22._0_4_ = (int)auVar28._0_4_;
      auVar22._4_4_ = (int)auVar28._4_4_;
      auVar22._8_4_ = (int)auVar28._8_4_;
      auVar22._12_4_ = (int)auVar28._12_4_;
      auVar28 = vpslld_avx(auVar22,0x17);
      auVar28 = vpaddd_avx(auVar50,auVar28);
      auVar19 = vfmadd213ps_fma(auVar28,auVar15,auVar50);
      auVar28 = vrcpps_avx(auVar19);
      auVar33._0_4_ = auVar18._0_4_ * auVar28._0_4_;
      auVar33._4_4_ = auVar18._4_4_ * auVar28._4_4_;
      auVar33._8_4_ = auVar18._8_4_ * auVar28._8_4_;
      auVar33._12_4_ = auVar18._12_4_ * auVar28._12_4_;
      auVar18 = vfmsub213ps_fma(auVar19,auVar33,auVar18);
      auVar18 = vfnmadd213ps_fma(auVar18,auVar28,auVar33);
      *(undefined1 (*) [16])*pauVar8 = auVar18;
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
      lVar11 = lVar11 + 4;
    }
    lVar7 = sVar5 * sVar4 * uVar13;
    for (; (int)lVar11 < iVar9; lVar11 = lVar11 + 1) {
      fVar1 = *(float *)((long)pvVar3 + lVar11 * 4 + lVar7);
      fVar14 = expf(-fVar1);
      auVar51 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar3 + lVar11 * 4 + lVar7) = fVar1 / (fVar14 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Swish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}